

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFrameMoving.h
# Opt level: O2

ChFrame<double> *
chrono::operator*(ChFrame<double> *__return_storage_ptr__,ChFrameMoving<double> *Fa,
                 ChFrame<double> *Fb)

{
  ChVector<double> local_58;
  ChQuaternion<double> local_38;
  
  local_58.m_data[2] = 0.0;
  local_38.m_data[0] = 1.0;
  local_38.m_data[3] = 0.0;
  local_58.m_data[0] = 0.0;
  local_58.m_data[1] = 0.0;
  local_38.m_data[1] = 0.0;
  local_38.m_data[2] = 0.0;
  ChFrame<double>::ChFrame(__return_storage_ptr__,&local_58,&local_38);
  ChFrame<double>::TransformLocalToParent(&Fa->super_ChFrame<double>,Fb,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

ChFrame<Real> operator*(const ChFrameMoving<Real>& Fa, const ChFrame<Real>& Fb) {
    // note: it should be not needed: falling back to ChFrame = ChFrame * ChFrame
    // could be enough, but the compiler still needs this operator.. why?
    ChFrame<Real> res;
    Fa.ChFrame<Real>::TransformLocalToParent(Fb, res);
    return res;
}